

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::HandleInstruction
          (Disassembler *this,spv_parsed_instruction_t *inst)

{
  spv_parsed_operand_t **ppsVar1;
  pointer *ppSVar2;
  undefined8 *puVar3;
  short sVar4;
  uint16_t uVar5;
  undefined2 uVar6;
  spv_number_kind_t sVar7;
  uint32_t uVar8;
  pointer pPVar9;
  long lVar10;
  ushort *puVar11;
  iterator __position;
  pointer puVar12;
  uint32_t *puVar13;
  undefined8 uVar14;
  ostream *poVar15;
  ostream *poVar16;
  undefined8 uVar17;
  _Map_pointer ppSVar18;
  Disassembler *pDVar19;
  _Elt_pointer pSVar20;
  _Elt_pointer pSVar21;
  uint32_t uVar22;
  undefined1 auVar23 [8];
  _Elt_pointer pSVar24;
  spv_parsed_operand_t *psVar25;
  uint uVar26;
  mapped_type *pmVar27;
  spv_parsed_instruction_t *psVar28;
  _Rb_tree_node<unsigned_int> *p_Var29;
  long lVar30;
  pointer pSVar31;
  spv_parsed_operand_t *psVar32;
  _Rb_tree_node<unsigned_int> *p_Var33;
  pointer puVar34;
  uint32_t *puVar35;
  spv_parsed_operand_t **ppsVar36;
  pointer pPVar37;
  InstructionDisassembler *pIVar38;
  ulong uVar39;
  ulong uVar40;
  size_t inst_byte_offset;
  pointer pSVar41;
  InstructionDisassembler *pIVar42;
  ParsedInstruction *inst_1;
  pointer pSVar43;
  ostream *poVar44;
  bool bVar45;
  uint32_t block_index;
  SingleBlock new_block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> post_order;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  id_to_index;
  uint *local_160;
  undefined1 local_158 [8];
  iterator iStack_150;
  uint *local_148;
  Disassembler *local_138;
  InstructionDisassembler *local_130;
  undefined1 local_128 [8];
  _Elt_pointer pSStack_120;
  spv_parsed_operand_t *psStack_118;
  spv_parsed_operand_t *psStack_110;
  spv_parsed_operand_t *psStack_108;
  spv_parsed_operand_t **local_100;
  spv_parsed_operand_t *psStack_f8;
  spv_parsed_operand_t *local_f0;
  undefined6 uStack_e8;
  undefined2 uStack_e2;
  undefined6 uStack_e0;
  undefined2 uStack_da;
  undefined4 uStack_d8;
  undefined2 uStack_d4;
  spv_parsed_instruction_t *local_d0;
  void *local_c8;
  iterator iStack_c0;
  uint *local_b8;
  pointer local_b0;
  ulong local_a8;
  undefined1 local_a0 [8];
  _Rb_tree_node<unsigned_int> local_98;
  void *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  pIVar38 = &this->instruction_disassembler_;
  disassemble::InstructionDisassembler::EmitSectionComment
            (pIVar38,inst,&this->inserted_decoration_space_,&this->inserted_debug_space_,
             &this->inserted_type_space_);
  if ((this->nested_indent_ != false) || (this->reorder_blocks_ == true)) {
    local_138 = this;
    if (inst->opcode == 0x38) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      pSVar31 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_130 = pIVar38;
      local_d0 = inst;
      if ((this->current_function_cfg_).blocks.
          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar31) {
        uVar40 = 0;
        do {
          pPVar37 = pSVar31[uVar40].instructions.
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pPVar37->instruction_).opcode != 0xf8) {
            __assert_fail("static_cast<spv::Op>(block.instructions[0].get()->opcode) == spv::Op::OpLabel"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                          ,0xf3,
                          "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
                         );
          }
          local_128._0_4_ = (pPVar37->instruction_).result_id;
          pmVar27 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_68,(key_type *)local_128);
          *pmVar27 = (mapped_type)uVar40;
          pPVar37 = pSVar31[uVar40].instructions.
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar9 = pSVar31[uVar40].instructions.
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar30 = (long)pPVar9 - (long)pPVar37;
          uVar39 = (lVar30 >> 4) * -0x5555555555555555;
          if (2 < uVar39) {
            sVar4 = *(short *)((long)pPVar37 + lVar30 + -0x56);
            if (sVar4 == 0xf7) {
              pSVar31[uVar40].successors.merge_block_id =
                   *(uint32_t *)
                    (*(long *)((long)pPVar37 + lVar30 + -0x60) +
                    (ulong)**(ushort **)((long)pPVar37 + lVar30 + -0x48) * 4);
            }
            else if (sVar4 == 0xf6) {
              lVar10 = *(long *)((long)pPVar37 + lVar30 + -0x60);
              puVar11 = *(ushort **)((long)pPVar37 + lVar30 + -0x48);
              pSVar31[uVar40].successors.merge_block_id =
                   *(uint32_t *)(lVar10 + (ulong)*puVar11 * 4);
              pSVar31[uVar40].successors.continue_block_id =
                   *(uint32_t *)(lVar10 + (ulong)puVar11[8] * 4);
            }
          }
          if (uVar39 < 2) {
            __assert_fail("block.instructions.size() >= 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                          ,0x10e,
                          "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
                         );
          }
          uVar5 = pPVar9[-1].instruction_.opcode;
          if (uVar5 == 0xf9) {
            uVar22 = pPVar9[-1].instruction_.words[(pPVar9[-1].instruction_.operands)->offset];
            if (pSVar31[uVar40].successors.merge_block_id == 0) {
              pSVar31[uVar40].successors.next_block_id = uVar22;
            }
            else {
              pSVar31[uVar40].successors.body_block_id = uVar22;
            }
          }
          else if (uVar5 == 0xfa) {
            puVar35 = pPVar9[-1].instruction_.words;
            psVar32 = pPVar9[-1].instruction_.operands;
            pSVar31[uVar40].successors.true_block_id = puVar35[psVar32[1].offset];
            pSVar31[uVar40].successors.false_block_id = puVar35[psVar32[2].offset];
          }
          else if ((uVar5 == 0xfb) && (1 < pPVar9[-1].instruction_.num_operands)) {
            uVar39 = 1;
            lVar30 = 0x10;
            do {
              local_a0._0_4_ =
                   pPVar9[-1].instruction_.words
                   [*(ushort *)((long)&(pPVar9[-1].instruction_.operands)->offset + lVar30)];
              __position._M_current =
                   pSVar31[uVar40].successors.case_block_ids.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  pSVar31[uVar40].successors.case_block_ids.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&pSVar31[uVar40].successors.case_block_ids,__position,(uint *)local_a0);
              }
              else {
                *__position._M_current = local_a0._0_4_;
                pSVar31[uVar40].successors.case_block_ids.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              uVar39 = uVar39 + 2;
              lVar30 = lVar30 + 0x20;
            } while (uVar39 < pPVar9[-1].instruction_.num_operands);
          }
          uVar40 = uVar40 + 1;
          pSVar31 = (local_138->current_function_cfg_).blocks.
                    super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar40 < (ulong)(((long)(local_138->current_function_cfg_).blocks.
                                         super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar31
                                  >> 3) * 0x2e8ba2e8ba2e8ba3));
      }
      this = local_138;
      local_b8 = (uint *)0x0;
      local_c8 = (void *)0x0;
      iStack_c0._M_current = (uint *)0x0;
      pSVar31 = (local_138->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar31->nest_level = 0;
      pSVar31->nest_level_assigned = true;
      local_128 = (undefined1  [8])0x0;
      uStack_e8 = 0;
      uStack_e2 = 0;
      uStack_e0 = 0;
      uStack_da = 0;
      psStack_f8 = (spv_parsed_operand_t *)0x0;
      local_f0 = (spv_parsed_operand_t *)0x0;
      psStack_108 = (spv_parsed_operand_t *)0x0;
      local_100 = (spv_parsed_operand_t **)0x0;
      psStack_118 = (spv_parsed_operand_t *)0x0;
      psStack_110 = (spv_parsed_operand_t *)0x0;
      pSStack_120 = (_Elt_pointer)0x8;
      psVar28 = (spv_parsed_instruction_t *)operator_new(0x40);
      ppsVar36 = &psVar28->operands;
      local_128 = (undefined1  [8])psVar28;
      psStack_118 = (spv_parsed_operand_t *)operator_new(0x200);
      psVar28->operands = psStack_118;
      psStack_108 = psStack_118 + 0x20;
      uStack_e0 = SUB86(ppsVar36,0);
      uStack_da = (undefined2)((ulong)ppsVar36 >> 0x30);
      uStack_e8 = SUB86(psStack_108,0);
      uStack_e2 = (undefined2)((ulong)psStack_108 >> 0x30);
      local_a0._0_4_ = 0;
      local_a0[4] = false;
      psStack_110 = psStack_118;
      local_100 = ppsVar36;
      psStack_f8 = psStack_118;
      local_f0 = psStack_118;
      std::
      stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
      ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
              *)local_128,(value_type *)local_a0);
      local_98.super__Rb_tree_node_base._M_left = &local_98.super__Rb_tree_node_base;
      local_98.super__Rb_tree_node_base._M_color = _S_red;
      local_98.super__Rb_tree_node_base._M_parent = (_Base_ptr)0x0;
      local_98._32_8_ = 0;
      local_98.super__Rb_tree_node_base._M_right = local_98.super__Rb_tree_node_base._M_left;
      if (psStack_f8 != psStack_118) {
        do {
          if (psStack_f8 == local_f0) {
            lVar30 = *(long *)(CONCAT26(uStack_da,uStack_e0) + -8);
            sVar7 = *(spv_number_kind_t *)(lVar30 + 0x1f8);
            psVar32 = (spv_parsed_operand_t *)(lVar30 + 0x200);
          }
          else {
            sVar7 = psStack_f8[-1].number_kind;
            psVar32 = psStack_f8;
          }
          local_160 = (uint *)CONCAT44(local_160._4_4_,sVar7);
          uVar22 = psVar32[-1].number_bit_width;
          if (psStack_f8 == local_f0) {
            operator_delete(local_f0,0x200);
            lVar10 = CONCAT26(uStack_da,uStack_e0);
            lVar30 = lVar10 + -8;
            uStack_e0 = (undefined6)lVar30;
            uStack_da = (undefined2)((ulong)lVar30 >> 0x30);
            local_f0 = *(spv_parsed_operand_t **)(lVar10 + -8);
            uStack_e8 = SUB86(local_f0 + 0x20,0);
            uStack_e2 = (undefined2)((ulong)(local_f0 + 0x20) >> 0x30);
            psStack_f8 = local_f0 + 0x1f;
          }
          else {
            psStack_f8 = psStack_f8 + -1;
          }
          psStack_f8 = (spv_parsed_operand_t *)&psStack_f8->number_kind;
          p_Var29 = &local_98;
          p_Var33 = (_Rb_tree_node<unsigned_int> *)local_98.super__Rb_tree_node_base._M_parent;
          if ((char)uVar22 == '\0') {
            for (; p_Var33 != (_Rb_tree_node<unsigned_int> *)0x0;
                p_Var33 = *(_Rb_tree_node<unsigned_int> **)
                           (&p_Var33->_M_storage + (ulong)bVar45 * 2 + -4)) {
              bVar45 = *(uint *)(p_Var33->_M_storage)._M_storage < (uint)local_160;
              if (!bVar45) {
                p_Var29 = p_Var33;
              }
            }
            p_Var33 = &local_98;
            if ((p_Var29 != &local_98) &&
               (p_Var33 = p_Var29, (uint)local_160 < *(uint *)(p_Var29->_M_storage)._M_storage)) {
              p_Var33 = &local_98;
            }
            if (p_Var33 == &local_98) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)local_a0,(uint *)&local_160);
              local_158[4] = true;
              local_158._0_4_ = (uint)local_160;
              std::
              stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
              ::push((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                      *)local_128,(value_type *)local_158);
              uVar40 = (ulong)local_160 & 0xffffffff;
              pSVar31 = (this->current_function_cfg_).blocks.
                        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (pSVar31[uVar40].nest_level_assigned == false) {
                __assert_fail("block.nest_level_assigned",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                              ,0x145,
                              "void spvtools::(anonymous namespace)::NestSuccessors(ControlFlowGraph &, const SingleBlock &, const std::unordered_map<uint32_t, uint32_t> &)"
                             );
              }
              uVar22 = pSVar31[uVar40].successors.merge_block_id;
              uVar8 = pSVar31[uVar40].nest_level;
              if (uVar22 != 0) {
                local_158._0_4_ = uVar22;
                pmVar27 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_68,(key_type *)local_158);
                uVar26 = *pmVar27;
                pSVar43 = (this->current_function_cfg_).blocks.
                          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pSVar43[uVar26].nest_level_assigned == false) {
                  pSVar43[uVar26].nest_level = uVar8;
                  pSVar43[uVar26].nest_level_assigned = true;
                }
              }
              local_158._0_4_ = pSVar31[uVar40].successors.continue_block_id;
              uVar22 = pSVar31[uVar40].nest_level;
              if (local_158._0_4_ != 0) {
                pmVar27 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_68,(key_type *)local_158);
                uVar26 = *pmVar27;
                pSVar43 = (this->current_function_cfg_).blocks.
                          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pSVar43[uVar26].nest_level_assigned == false) {
                  pSVar43[uVar26].nest_level = uVar22 + 1;
                  pSVar43[uVar26].nest_level_assigned = true;
                }
              }
              local_158._0_4_ = pSVar31[uVar40].successors.true_block_id;
              uVar22 = pSVar31[uVar40].nest_level;
              if (local_158._0_4_ != 0) {
                pmVar27 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_68,(key_type *)local_158);
                uVar26 = *pmVar27;
                pSVar43 = (this->current_function_cfg_).blocks.
                          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pSVar43[uVar26].nest_level_assigned == false) {
                  pSVar43[uVar26].nest_level = uVar22 + 2;
                  pSVar43[uVar26].nest_level_assigned = true;
                }
              }
              local_158._0_4_ = pSVar31[uVar40].successors.false_block_id;
              uVar22 = pSVar31[uVar40].nest_level;
              if (local_158._0_4_ != 0) {
                pmVar27 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_68,(key_type *)local_158);
                uVar26 = *pmVar27;
                pSVar43 = (this->current_function_cfg_).blocks.
                          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pSVar43[uVar26].nest_level_assigned == false) {
                  pSVar43[uVar26].nest_level = uVar22 + 2;
                  pSVar43[uVar26].nest_level_assigned = true;
                }
              }
              local_158._0_4_ = pSVar31[uVar40].successors.body_block_id;
              uVar22 = pSVar31[uVar40].nest_level;
              if (local_158._0_4_ != 0) {
                pmVar27 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_68,(key_type *)local_158);
                uVar26 = *pmVar27;
                pSVar43 = (this->current_function_cfg_).blocks.
                          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pSVar43[uVar26].nest_level_assigned == false) {
                  pSVar43[uVar26].nest_level = uVar22 + 2;
                  pSVar43[uVar26].nest_level_assigned = true;
                }
              }
              local_158._0_4_ = pSVar31[uVar40].successors.next_block_id;
              uVar22 = pSVar31[uVar40].nest_level;
              if (local_158._0_4_ != 0) {
                pmVar27 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_68,(key_type *)local_158);
                uVar26 = *pmVar27;
                pSVar43 = (this->current_function_cfg_).blocks.
                          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (pSVar43[uVar26].nest_level_assigned == false) {
                  pSVar43[uVar26].nest_level = uVar22;
                  pSVar43[uVar26].nest_level_assigned = true;
                }
              }
              puVar12 = *(pointer *)((long)&pSVar31[uVar40].successors.case_block_ids + 8);
              for (puVar34 = *(pointer *)
                              &pSVar31[uVar40].successors.case_block_ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl; puVar34 != puVar12; puVar34 = puVar34 + 1) {
                uVar22 = pSVar31[uVar40].nest_level;
                local_158._0_4_ = *puVar34;
                if (*puVar34 != 0) {
                  pmVar27 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&local_68,(key_type *)local_158);
                  uVar26 = *pmVar27;
                  pSVar43 = (local_138->current_function_cfg_).blocks.
                            super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (pSVar43[uVar26].nest_level_assigned == false) {
                    pSVar43[uVar26].nest_level = uVar22 + 2;
                    pSVar43[uVar26].nest_level_assigned = true;
                  }
                }
              }
              pSVar31[uVar40].reachable = true;
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_128,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar31[uVar40].successors.true_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_128,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar31[uVar40].successors.false_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_128,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar31[uVar40].successors.body_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_128,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar31[uVar40].successors.next_block_id);
              puVar13 = *(pointer *)((long)&pSVar31[uVar40].successors.case_block_ids + 8);
              for (puVar35 = *(uint32_t **)
                              &pSVar31[uVar40].successors.case_block_ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl; puVar35 != puVar13; puVar35 = puVar35 + 1) {
                VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                               *)local_128,
                              (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&local_68,*puVar35);
              }
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_128,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar31[uVar40].successors.continue_block_id);
              VisitSuccesor((stack<spvtools::(anonymous_namespace)::StackEntry,_std::deque<spvtools::(anonymous_namespace)::StackEntry,_std::allocator<spvtools::(anonymous_namespace)::StackEntry>_>_>
                             *)local_128,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&local_68,pSVar31[uVar40].successors.merge_block_id);
              this = local_138;
            }
          }
          else if (iStack_c0._M_current == local_b8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,iStack_c0,
                       (uint *)&local_160);
          }
          else {
            *iStack_c0._M_current = (uint)local_160;
            iStack_c0._M_current = iStack_c0._M_current + 1;
          }
        } while (psStack_f8 != psStack_118);
      }
      local_158._0_4_ = 0;
      local_158[4] = false;
      local_158._5_3_ = 0;
      iStack_150._M_current = (uint *)0x0;
      local_148 = (uint *)0x0;
      local_160 = iStack_c0._M_current;
      local_70 = local_c8;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                ();
      pSVar31 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->current_function_cfg_).blocks.
          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar31) {
        lVar30 = 0x55;
        uVar40 = 0;
        do {
          if (*(char *)((long)&pSVar31->byte_offset + lVar30) == '\0') {
            local_160 = (uint *)CONCAT44(local_160._4_4_,(uint)uVar40);
            if (iStack_150._M_current == local_148) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158,iStack_150
                         ,(uint *)&local_160);
            }
            else {
              *iStack_150._M_current = (uint)uVar40;
              iStack_150._M_current = iStack_150._M_current + 1;
            }
            *(undefined4 *)((long)pSVar31 + lVar30 + -5) = 0;
            *(undefined1 *)((long)pSVar31 + lVar30 + -1) = 1;
          }
          uVar40 = uVar40 + 1;
          pSVar31 = (this->current_function_cfg_).blocks.
                    super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar30 = lVar30 + 0x58;
        } while (uVar40 < (ulong)(((long)(this->current_function_cfg_).blocks.
                                         super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar31
                                  >> 3) * 0x2e8ba2e8ba2e8ba3));
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_a0,(_Link_type)local_98.super__Rb_tree_node_base._M_parent);
      auVar23 = local_128;
      if (local_128 != (undefined1  [8])0x0) {
        ppSVar18 = (_Map_pointer)CONCAT26(uStack_da,uStack_e0);
        if (local_100 < ppSVar18 + 1) {
          ppsVar36 = local_100 + -1;
          do {
            ppsVar1 = ppsVar36 + 1;
            ppsVar36 = ppsVar36 + 1;
            operator_delete(*ppsVar1,0x200);
          } while (ppsVar36 < ppSVar18);
        }
        operator_delete((void *)auVar23,(long)pSStack_120 << 3);
        this = local_138;
      }
      if (local_c8 != (void *)0x0) {
        operator_delete(local_c8,(long)local_b8 - (long)local_c8);
      }
      pSVar31 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar43 = (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)iStack_150._M_current - (long)local_158 >> 2 !=
          ((long)pSVar43 - (long)pSVar31 >> 3) * 0x2e8ba2e8ba2e8ba3) {
        __assert_fail("block_order.size() == current_function_cfg_.blocks.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                      ,0x1ef,"void spvtools::(anonymous namespace)::Disassembler::EmitCFG()");
      }
      if (pSVar43 != pSVar31) {
        uVar40 = 0;
        do {
          pIVar38 = local_130;
          uVar26 = (uint)uVar40;
          if (this->reorder_blocks_ == true) {
            uVar26 = *(uint *)((long)local_158 + uVar40 * 4);
          }
          if (pSVar31[uVar26].nest_level_assigned == false) {
            __assert_fail("block.nest_level_assigned",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                          ,0x1fa,"void spvtools::(anonymous namespace)::Disassembler::EmitCFG()");
          }
          pSVar31 = pSVar31 + uVar26;
          pPVar37 = (pSVar31->instructions).
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar9 = (pSVar31->instructions).
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pPVar37 != pPVar9) {
            inst_byte_offset = pSVar31->byte_offset;
            do {
              disassemble::InstructionDisassembler::EmitInstructionImpl
                        (pIVar38,&pPVar37->instruction_,inst_byte_offset,pSVar31->nest_level,true);
              inst_byte_offset = inst_byte_offset + (ulong)(pPVar37->instruction_).num_words * 4;
              pPVar37 = pPVar37 + 1;
            } while (pPVar37 != pPVar9);
          }
          uVar40 = (ulong)((uint)uVar40 + 1);
          pSVar31 = (local_138->current_function_cfg_).blocks.
                    super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar43 = (local_138->current_function_cfg_).blocks.
                    super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar39 = ((long)pSVar43 - (long)pSVar31 >> 3) * 0x2e8ba2e8ba2e8ba3;
          this = local_138;
        } while (uVar40 <= uVar39 && uVar39 - uVar40 != 0);
      }
      pSVar41 = pSVar31;
      if (pSVar43 != pSVar31) {
        do {
          puVar34 = (pSVar41->successors).case_block_ids.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (puVar34 != (pointer)0x0) {
            operator_delete(puVar34,(long)(pSVar41->successors).case_block_ids.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)puVar34);
          }
          pPVar9 = (pSVar41->instructions).
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar37 = (pSVar41->instructions).
                         super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                         ._M_impl.super__Vector_impl_data._M_start; this = local_138,
              pPVar37 != pPVar9; pPVar37 = pPVar37 + 1) {
            psVar32 = (pPVar37->operands_)._M_t.
                      super___uniq_ptr_impl<spv_parsed_operand_t,_std::default_delete<spv_parsed_operand_t[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv_parsed_operand_t_*,_std::default_delete<spv_parsed_operand_t[]>_>
                      .super__Head_base<0UL,_spv_parsed_operand_t_*,_false>._M_head_impl;
            if (psVar32 != (spv_parsed_operand_t *)0x0) {
              operator_delete__(psVar32);
            }
            (pPVar37->operands_)._M_t.
            super___uniq_ptr_impl<spv_parsed_operand_t,_std::default_delete<spv_parsed_operand_t[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_spv_parsed_operand_t_*,_std::default_delete<spv_parsed_operand_t[]>_>
            .super__Head_base<0UL,_spv_parsed_operand_t_*,_false>._M_head_impl =
                 (spv_parsed_operand_t *)0x0;
          }
          pPVar37 = (pSVar41->instructions).
                    super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pPVar37 != (pointer)0x0) {
            operator_delete(pPVar37,(long)(pSVar41->instructions).
                                          super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)pPVar37);
          }
          pSVar41 = pSVar41 + 1;
        } while (pSVar41 != pSVar43);
        (this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar31;
      }
      if ((value_type)local_158 != (value_type)0x0) {
        operator_delete((void *)local_158,(long)local_148 - (long)local_158);
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      pIVar38 = local_130;
      inst = local_d0;
    }
    else if (inst->opcode == 0xf8) {
      uStack_e0 = 0;
      uStack_da = 0;
      uStack_d8 = 0;
      uStack_d4 = 0;
      local_f0 = (spv_parsed_operand_t *)0x0;
      uStack_e8 = 0;
      uStack_e2 = 0;
      local_100 = (spv_parsed_operand_t **)0x0;
      psStack_f8 = (spv_parsed_operand_t *)0x0;
      psStack_110 = (spv_parsed_operand_t *)0x0;
      psStack_108 = (spv_parsed_operand_t *)0x0;
      pSStack_120 = (_Elt_pointer)0x0;
      psStack_118 = (spv_parsed_operand_t *)0x0;
      local_128 = (undefined1  [8])this->byte_offset_;
      local_68._M_buckets = (__buckets_ptr)inst;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&pSStack_120,(spv_parsed_instruction_t **)&local_68);
      pIVar38 = (InstructionDisassembler *)
                (this->current_function_cfg_).blocks.
                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar38 ==
          (InstructionDisassembler *)
          (this->current_function_cfg_).blocks.
          super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pIVar42 = (InstructionDisassembler *)
                  (this->current_function_cfg_).blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pIVar38 - (long)pIVar42 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar30 = (long)pIVar38 - (long)pIVar42 >> 3;
        uVar39 = lVar30 * 0x2e8ba2e8ba2e8ba3;
        uVar40 = 1;
        if (pIVar38 != pIVar42) {
          uVar40 = uVar39;
        }
        local_a8 = uVar40 + uVar39;
        if (0x1745d1745d1745c < local_a8) {
          local_a8 = 0x1745d1745d1745d;
        }
        if (CARRY8(uVar40,uVar39)) {
          local_a8 = 0x1745d1745d1745d;
        }
        if (local_a8 == 0) {
          pSVar31 = (pointer)0x0;
          local_d0 = inst;
        }
        else {
          local_d0 = inst;
          pSVar31 = (pointer)operator_new(local_a8 * 0x58);
        }
        (&pSVar31->byte_offset)[lVar30] = (size_t)local_128;
        *(_Elt_pointer *)
         ((long)&(pSVar31->instructions).
                 super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
         + lVar30 * 8) = pSStack_120;
        *(spv_parsed_operand_t **)
         ((long)&(pSVar31->instructions).
                 super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
         + lVar30 * 8 + 8U) = psStack_118;
        *(spv_parsed_operand_t **)
         ((long)&(pSVar31->instructions).
                 super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
         + lVar30 * 8 + 0x10U) = psStack_110;
        psStack_110 = (spv_parsed_operand_t *)0x0;
        pSStack_120 = (_Elt_pointer)0x0;
        psStack_118 = (spv_parsed_operand_t *)0x0;
        *(spv_parsed_operand_t **)((long)&(pSVar31->successors).body_block_id + lVar30 * 8) =
             psStack_f8;
        puVar3 = (undefined8 *)((long)&(pSVar31->successors).merge_block_id + lVar30 * 8);
        *puVar3 = psStack_108;
        puVar3[1] = local_100;
        *(spv_parsed_operand_t **)((long)&(pSVar31->successors).case_block_ids + lVar30 * 8) =
             local_f0;
        *(ulong *)((long)&(pSVar31->successors).case_block_ids + lVar30 * 8 + 8U) =
             CONCAT26(uStack_e2,uStack_e8);
        *(ulong *)((long)&(pSVar31->successors).case_block_ids + lVar30 * 8 + 0x10U) =
             CONCAT26(uStack_da,uStack_e0);
        uStack_e0 = 0;
        uStack_da = 0;
        local_f0 = (spv_parsed_operand_t *)0x0;
        uStack_e8 = 0;
        uStack_e2 = 0;
        *(undefined2 *)(&pSVar31->nest_level_assigned + lVar30 * 8) = uStack_d4;
        (&pSVar31->nest_level)[lVar30 * 2] = uStack_d8;
        local_130 = pIVar42;
        local_b0 = pSVar31;
        pDVar19 = local_138;
        for (; local_138 = pDVar19, pIVar38 != pIVar42;
            pIVar42 = (InstructionDisassembler *)&(pIVar42->id_comments_)._M_h._M_before_begin) {
          pSVar31->byte_offset = (size_t)pIVar42->grammar_;
          *(ostream **)
           &(pSVar31->instructions).
            super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
            ._M_impl = pIVar42->stream_;
          *(pointer *)
           ((long)&(pSVar31->instructions).
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
           + 8) = *(pointer *)&pIVar42->print_;
          *(pointer *)
           ((long)&(pSVar31->instructions).
                   super__Vector_base<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
           + 0x10) = *(pointer *)&pIVar42->nested_indent_;
          pIVar42->nested_indent_ = false;
          *(undefined3 *)&pIVar42->field_0x19 = 0;
          pIVar42->comment_ = 0;
          pIVar42->stream_ = (ostream *)0x0;
          pIVar42->print_ = false;
          pIVar42->color_ = false;
          *(undefined2 *)&pIVar42->field_0x12 = 0;
          pIVar42->indent_ = 0;
          uVar14 = *(undefined8 *)
                    ((long)&(pIVar42->name_mapper_).super__Function_base._M_functor + 8);
          (pSVar31->successors).body_block_id = (int)uVar14;
          (pSVar31->successors).next_block_id = (int)((ulong)uVar14 >> 0x20);
          uVar14 = *(undefined8 *)&pIVar42->show_byte_offset_;
          uVar17 = *(undefined8 *)&(pIVar42->name_mapper_).super__Function_base._M_functor;
          (pSVar31->successors).merge_block_id = (int)uVar14;
          (pSVar31->successors).continue_block_id = (int)((ulong)uVar14 >> 0x20);
          (pSVar31->successors).true_block_id = (int)uVar17;
          (pSVar31->successors).false_block_id = (int)((ulong)uVar17 >> 0x20);
          *(_Manager_type *)
           &(pSVar31->successors).case_block_ids.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl =
               (pIVar42->name_mapper_).super__Function_base._M_manager;
          *(_Invoker_type *)((long)&(pSVar31->successors).case_block_ids + 8) =
               (pIVar42->name_mapper_)._M_invoker;
          *(__buckets_ptr *)((long)&(pSVar31->successors).case_block_ids + 0x10) =
               (pIVar42->id_comments_)._M_h._M_buckets;
          (pIVar42->id_comments_)._M_h._M_buckets = (__buckets_ptr)0x0;
          (pIVar42->name_mapper_).super__Function_base._M_manager = (_Manager_type)0x0;
          (pIVar42->name_mapper_)._M_invoker = (_Invoker_type)0x0;
          uVar6 = *(undefined2 *)((long)&(pIVar42->id_comments_)._M_h._M_bucket_count + 4);
          pSVar31->nest_level_assigned = (bool)(char)uVar6;
          pSVar31->reachable = (bool)(char)((ushort)uVar6 >> 8);
          pSVar31->nest_level = (uint32_t)(pIVar42->id_comments_)._M_h._M_bucket_count;
          poVar16 = *(ostream **)&pIVar42->print_;
          poVar15 = pIVar42->stream_;
          for (poVar44 = poVar15; poVar44 != poVar16; poVar44 = poVar44 + 0x30) {
            if (*(void **)(poVar44 + 0x28) != (void *)0x0) {
              operator_delete__(*(void **)(poVar44 + 0x28));
            }
            *(undefined8 *)(poVar44 + 0x28) = 0;
          }
          if (poVar15 != (ostream *)0x0) {
            operator_delete(poVar15,*(long *)&pIVar42->nested_indent_ - (long)poVar15);
          }
          pSVar31 = pSVar31 + 1;
          pDVar19 = local_138;
        }
        if (local_130 != (InstructionDisassembler *)0x0) {
          operator_delete(local_130,
                          (long)(pDVar19->current_function_cfg_).blocks.
                                super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_130
                         );
        }
        (pDVar19->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_start = local_b0;
        (pDVar19->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar31 + 1;
        (pDVar19->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_b0 + local_a8;
        inst = local_d0;
      }
      else {
        pIVar38->grammar_ = (AssemblyGrammar *)local_128;
        pIVar38->stream_ = (ostream *)pSStack_120;
        *(spv_parsed_operand_t **)&pIVar38->print_ = psStack_118;
        *(spv_parsed_operand_t **)&pIVar38->nested_indent_ = psStack_110;
        psStack_110 = (spv_parsed_operand_t *)0x0;
        pSStack_120 = (_Elt_pointer)0x0;
        psStack_118 = (spv_parsed_operand_t *)0x0;
        *(spv_parsed_operand_t **)
         ((long)&(pIVar38->name_mapper_).super__Function_base._M_functor + 8) = psStack_f8;
        *(spv_parsed_operand_t **)&pIVar38->show_byte_offset_ = psStack_108;
        *(spv_parsed_operand_t ***)&(pIVar38->name_mapper_).super__Function_base._M_functor =
             local_100;
        (pIVar38->name_mapper_).super__Function_base._M_manager = (_Manager_type)local_f0;
        (pIVar38->name_mapper_)._M_invoker = (_Invoker_type)CONCAT26(uStack_e2,uStack_e8);
        (pIVar38->id_comments_)._M_h._M_buckets = (__buckets_ptr)CONCAT26(uStack_da,uStack_e0);
        uStack_e0 = 0;
        uStack_da = 0;
        local_f0 = (spv_parsed_operand_t *)0x0;
        uStack_e8 = 0;
        uStack_e2 = 0;
        *(undefined2 *)((long)&(pIVar38->id_comments_)._M_h._M_bucket_count + 4) = uStack_d4;
        *(undefined4 *)&(pIVar38->id_comments_)._M_h._M_bucket_count = uStack_d8;
        ppSVar2 = &(this->current_function_cfg_).blocks.
                   super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar2 = *ppSVar2 + 1;
      }
      this = local_138;
      pSVar20 = pSStack_120;
      pSVar21 = pSStack_120;
      psVar32 = psStack_118;
      if (local_f0 != (spv_parsed_operand_t *)0x0) {
        operator_delete(local_f0,CONCAT26(uStack_da,uStack_e0) - (long)local_f0);
        this = local_138;
        pSVar20 = pSStack_120;
        pSVar21 = pSStack_120;
        psVar32 = psStack_118;
      }
      for (; psVar25 = psStack_118, pSVar24 = pSStack_120, local_138 = this,
          (spv_parsed_operand_t *)pSVar20 != psStack_118; pSVar20 = pSVar20 + 6) {
        pSStack_120 = pSVar21;
        psStack_118 = psVar32;
        if (pSVar20[5] != (StackEntry)0x0) {
          operator_delete__((void *)pSVar20[5]);
        }
        pSVar20[5].block_index = 0;
        pSVar20[5].post_visit = false;
        *(undefined3 *)&pSVar20[5].field_0x5 = 0;
        this = local_138;
        pSVar21 = pSStack_120;
        psVar32 = psStack_118;
        psStack_118 = psVar25;
        pSStack_120 = pSVar24;
      }
      if (pSStack_120 != (_Elt_pointer)0x0) {
        uVar40 = (long)psStack_110 - (long)pSStack_120;
        pSStack_120 = pSVar21;
        psStack_118 = psVar32;
        operator_delete(pSVar24,uVar40);
        this = local_138;
      }
      goto LAB_0020d143;
    }
    pSVar31 = (this->current_function_cfg_).blocks.
              super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->current_function_cfg_).blocks.
        super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
        ._M_impl.super__Vector_impl_data._M_start != pSVar31) {
      local_128 = (undefined1  [8])inst;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&pSVar31[-1].instructions,(spv_parsed_instruction_t **)local_128);
      goto LAB_0020d143;
    }
  }
  disassemble::InstructionDisassembler::EmitInstructionImpl(pIVar38,inst,this->byte_offset_,0,false)
  ;
LAB_0020d143:
  lVar30 = (ulong)inst->num_words * 4;
  this->byte_offset_ = this->byte_offset_ + lVar30;
  return (spv_result_t)lVar30;
}

Assistant:

spv_result_t Disassembler::HandleInstruction(
    const spv_parsed_instruction_t& inst) {
  instruction_disassembler_.EmitSectionComment(inst, inserted_decoration_space_,
                                               inserted_debug_space_,
                                               inserted_type_space_);

  // When nesting needs to be calculated or when the blocks are reordered, we
  // have to have the full picture of the CFG first.  Defer processing of the
  // instructions until the entire function is visited.  This is not done
  // without those options (even if simpler) to improve debuggability; for
  // example to be able to see whatever is parsed so far even if there is a
  // parse error.
  if (nested_indent_ || reorder_blocks_) {
    switch (static_cast<spv::Op>(inst.opcode)) {
      case spv::Op::OpLabel: {
        // Add a new block to the CFG
        SingleBlock new_block;
        new_block.byte_offset = byte_offset_;
        new_block.instructions.emplace_back(&inst);
        current_function_cfg_.blocks.push_back(std::move(new_block));
        break;
      }
      case spv::Op::OpFunctionEnd:
        // Process the CFG and output the instructions
        EmitCFG();
        // Output OpFunctionEnd itself too
        [[fallthrough]];
      default:
        if (!current_function_cfg_.blocks.empty()) {
          // If in a function, stash the instruction for later.
          current_function_cfg_.blocks.back().instructions.emplace_back(&inst);
        } else {
          // Otherwise emit the instruction right away.
          instruction_disassembler_.EmitInstruction(inst, byte_offset_);
        }
        break;
    }
  } else {
    instruction_disassembler_.EmitInstruction(inst, byte_offset_);
  }

  byte_offset_ += inst.num_words * sizeof(uint32_t);

  return SPV_SUCCESS;
}